

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularPrimitive::
GenerateSerializeWithCachedSizesToArray(SingularPrimitive *this,Printer *p)

{
  FieldDescriptor *pFVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  if (pFVar1->number_ < 0x10) {
    uVar2 = (uint)pFVar1->type_;
    if ((uVar2 < 0xf) && ((0x4028U >> (uVar2 & 0x1f) & 1) != 0)) {
      pcVar3 = 
      "\n      target =\n          $pbi$::WireFormatLite::Write$declared_type$ToArrayWithField<$number$>(\n              stream, this_._internal_$name$(), target);\n    "
      ;
      uVar4 = 0x9e;
      goto LAB_00b87bde;
    }
  }
  pcVar3 = 
  "\n      target = stream->EnsureSpace(target);\n      target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(\n          $number$, this_._internal_$name$(), target);\n    "
  ;
  uVar4 = 0xab;
LAB_00b87bde:
  io::Printer::Emit(p,uVar4,pcVar3);
  return;
}

Assistant:

void SingularPrimitive::GenerateSerializeWithCachedSizesToArray(
    io::Printer* p) const {
  if ((field_->number() < 16) &&
      (field_->type() == FieldDescriptor::TYPE_INT32 ||
       field_->type() == FieldDescriptor::TYPE_INT64 ||
       field_->type() == FieldDescriptor::TYPE_ENUM)) {
    // Call special non-inlined routine with tag number hardcoded as a
    // template parameter that handles the EnsureSpace and the writing
    // of the tag+value to the array
    p->Emit(R"cc(
      target =
          $pbi$::WireFormatLite::Write$declared_type$ToArrayWithField<$number$>(
              stream, this_._internal_$name$(), target);
    )cc");
  } else {
    p->Emit(R"cc(
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(
          $number$, this_._internal_$name$(), target);
    )cc");
  }
}